

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

PassToken __thiscall
spvtools::CreateReduceLoadSizePass(spvtools *this,double load_replacement_threshold)

{
  unique_ptr<spvtools::opt::ReduceLoadSize,_std::default_delete<spvtools::opt::ReduceLoadSize>_>
  local_28;
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  local_20;
  double local_18;
  double load_replacement_threshold_local;
  
  local_18 = load_replacement_threshold;
  load_replacement_threshold_local = (double)this;
  MakeUnique<spvtools::opt::ReduceLoadSize,double&>((spvtools *)&local_28,&local_18);
  MakeUnique<spvtools::Optimizer::PassToken::Impl,std::unique_ptr<spvtools::opt::ReduceLoadSize,std::default_delete<spvtools::opt::ReduceLoadSize>>>
            ((spvtools *)&local_20,&local_28);
  Optimizer::PassToken::PassToken((PassToken *)this,&local_20);
  std::
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ::~unique_ptr(&local_20);
  std::
  unique_ptr<spvtools::opt::ReduceLoadSize,_std::default_delete<spvtools::opt::ReduceLoadSize>_>::
  ~unique_ptr(&local_28);
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )this;
}

Assistant:

Optimizer::PassToken CreateReduceLoadSizePass(
    double load_replacement_threshold) {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::ReduceLoadSize>(load_replacement_threshold));
}